

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O3

iterator * __thiscall
HighsMatrixSlice<HighsTripletTreeSliceInOrder>::iterator::operator++(iterator *this)

{
  HighsInt *__args;
  double **ppdVar1;
  int iVar2;
  iterator __position;
  pointer piVar3;
  int iVar4;
  long lVar5;
  HighsInt *pHVar6;
  
  iVar2 = this->currentNode;
  iVar4 = this->nodeRight[iVar2];
  lVar5 = (long)iVar4;
  if (lVar5 == -1) {
    piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = piVar3[-1];
    this->currentNode = iVar4;
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3 + -1;
  }
  else {
    this->currentNode = iVar4;
    pHVar6 = this->nodeLeft;
    if (pHVar6[lVar5] != -1) {
      __args = &this->currentNode;
      do {
        __position._M_current =
             (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->stack,__position,__args);
          pHVar6 = this->nodeLeft;
        }
        else {
          *__position._M_current = (int)lVar5;
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        iVar4 = pHVar6[*__args];
        lVar5 = (long)iVar4;
        *__args = iVar4;
      } while (pHVar6[lVar5] != -1);
    }
  }
  iVar4 = iVar4 - iVar2;
  (this->pos_).index_ = (this->pos_).index_ + iVar4;
  ppdVar1 = &(this->pos_).value_;
  *ppdVar1 = *ppdVar1 + iVar4;
  return this;
}

Assistant:

iterator& operator++() {
      HighsInt offset = -currentNode;
      if (nodeRight[currentNode] != -1) {
        currentNode = nodeRight[currentNode];
        while (nodeLeft[currentNode] != -1) {
          stack.push_back(currentNode);
          currentNode = nodeLeft[currentNode];
        }
      } else {
        currentNode = stack.back();
        stack.pop_back();
      }
      offset += currentNode;
      pos_.index_ += offset;
      pos_.value_ += offset;
      return *this;
    }